

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhaptic.c
# Opt level: O1

_Bool lhap_effect2lin(ff_effect *lin,ALLEGRO_HAPTIC_EFFECT *al)

{
  int iVar1;
  _Bool _Var2;
  __u16 _Var3;
  __s16 _Var4;
  double dVar5;
  double dVar6;
  
  *(undefined8 *)&(lin->u).periodic.envelope.fade_level = 0;
  (lin->u).periodic.custom_data = (__s16 *)0x0;
  *(undefined8 *)&lin->u = 0;
  *(undefined8 *)&(lin->u).constant.envelope.fade_level = 0;
  lin->type = 0;
  lin->id = 0;
  lin->direction = 0;
  (lin->trigger).button = 0;
  *(undefined8 *)&(lin->trigger).interval = 0;
  iVar1 = al->type;
  if (iVar1 < 0x10) {
    switch(iVar1) {
    case 1:
      _Var3 = 0x50;
      break;
    case 2:
      _Var3 = 0x51;
      break;
    default:
      return false;
    case 4:
      _Var3 = 0x52;
      break;
    case 8:
      _Var3 = 0x53;
    }
  }
  else if (iVar1 < 0x40) {
    if (iVar1 == 0x10) {
      _Var3 = 0x54;
    }
    else {
      if (iVar1 != 0x20) {
        return false;
      }
      _Var3 = 0x55;
    }
  }
  else if (iVar1 == 0x40) {
    _Var3 = 0x56;
  }
  else {
    if (iVar1 != 0x80) {
      return false;
    }
    _Var3 = 0x57;
  }
  lin->type = _Var3;
  dVar5 = round(((al->direction).angle * 49152.0) / 6.283185307179586);
  lin->direction = (__u16)(int)dVar5;
  lin->id = -1;
  dVar5 = (al->replay).delay;
  if (dVar5 < 0.0) {
    return false;
  }
  if (32.767 < dVar5) {
    return false;
  }
  dVar5 = round(dVar5 * 1000.0);
  (lin->replay).delay = (__u16)(int)dVar5;
  dVar5 = (al->replay).length;
  if (dVar5 < 0.0) {
    return false;
  }
  if (32.767 < dVar5) {
    return false;
  }
  dVar5 = round(dVar5 * 1000.0);
  (lin->replay).length = (__u16)(int)dVar5;
  switch(lin->type) {
  case 0x50:
    dVar5 = (al->data).constant.level;
    if (dVar5 < 0.0) {
      return false;
    }
    if (1.0 < dVar5) {
      return false;
    }
    dVar5 = round(dVar5 * 32767.0);
    (lin->u).constant.level = (__s16)(int)dVar5;
    break;
  case 0x51:
    if ((al->data).periodic.custom_data != (double *)0x0) {
      return false;
    }
    dVar5 = (al->data).constant.envelope.attack_level;
    if (1.0 < ABS(dVar5)) {
      return false;
    }
    dVar5 = round(dVar5 * 32766.0);
    (lin->u).constant.envelope.attack_level = (__u16)(int)dVar5;
    dVar5 = (al->data).constant.envelope.fade_length;
    if (32.767 < ABS(dVar5)) {
      return false;
    }
    dVar5 = round(dVar5 * 1000.0);
    (lin->u).constant.envelope.fade_length = (__u16)(int)dVar5;
    dVar5 = (al->data).constant.envelope.attack_length;
    if (0.0 <= dVar5) {
      if (32.767 < dVar5) {
        return false;
      }
      dVar5 = round(dVar5 * 1000.0);
      (lin->u).constant.envelope.attack_length = (__u16)(int)dVar5;
      dVar5 = (al->data).constant.envelope.fade_level;
      if (0.0 <= dVar5) {
        if (32.767 < dVar5) {
          return false;
        }
        dVar5 = round(dVar5 * 1000.0);
        (lin->u).constant.envelope.fade_level = (__u16)(int)dVar5;
        iVar1 = (al->data).periodic.waveform;
        if (iVar1 < 0x800) {
          if (iVar1 == 0x100) {
            _Var4 = 0x58;
          }
          else if (iVar1 == 0x200) {
            _Var4 = 0x59;
          }
          else {
            if (iVar1 != 0x400) {
              return false;
            }
            _Var4 = 0x5a;
          }
        }
        else if (iVar1 == 0x800) {
          _Var4 = 0x5b;
        }
        else if (iVar1 == 0x1000) {
          _Var4 = 0x5c;
        }
        else {
          if (iVar1 != 0x2000) {
            return false;
          }
          _Var4 = 0x5d;
        }
        (lin->u).constant.level = _Var4;
        _Var2 = lhap_envelope2lin((ff_envelope *)&(lin->u).ramp.envelope.fade_level,
                                  (ALLEGRO_HAPTIC_ENVELOPE *)&(al->data).ramp.envelope.fade_level);
        return _Var2;
      }
      return false;
    }
    return false;
  case 0x52:
    _Var2 = lhap_envelope2lin(&(lin->u).constant.envelope,&(al->data).constant.envelope);
    if (!_Var2) {
      return false;
    }
    dVar5 = (al->data).constant.level;
    dVar6 = ABS(dVar5);
    if (dVar6 <= 1.0) {
      dVar5 = round(dVar5 * 32766.0);
      (lin->u).constant.level = (__s16)(int)dVar5;
      return true;
    }
    return dVar6 <= 1.0;
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    dVar5 = (al->data).ramp.envelope.fade_level;
    if (1.0 < ABS(dVar5)) {
      return false;
    }
    dVar5 = round(dVar5 * 32766.0);
    (lin->u).ramp.envelope.fade_level = (__u16)(int)dVar5;
    dVar5 = (al->data).constant.envelope.fade_level;
    if (dVar5 < 0.0) {
      return false;
    }
    if (1.0 < dVar5) {
      return false;
    }
    dVar5 = round(dVar5 * 32767.0);
    (lin->u).constant.envelope.fade_level = (__u16)(int)dVar5;
    dVar5 = (al->data).constant.envelope.attack_level;
    if (1.0 < ABS(dVar5)) {
      return false;
    }
    dVar5 = round(dVar5 * 32766.0);
    (lin->u).constant.envelope.attack_level = (__u16)(int)dVar5;
    dVar5 = (al->data).constant.level;
    if (dVar5 < 0.0) {
      return false;
    }
    if (1.0 < dVar5) {
      return false;
    }
    dVar5 = round(dVar5 * 32767.0);
    (lin->u).constant.level = (__s16)(int)dVar5;
    dVar5 = (al->data).constant.envelope.fade_length;
    if (1.0 < ABS(dVar5)) {
      return false;
    }
    dVar5 = round(dVar5 * 32766.0);
    (lin->u).constant.envelope.fade_length = (__u16)(int)dVar5;
    break;
  case 0x57:
    _Var2 = lhap_envelope2lin((ff_envelope *)&(lin->u).constant.envelope.attack_level,
                              (ALLEGRO_HAPTIC_ENVELOPE *)&(al->data).constant.envelope.attack_level)
    ;
    if (!_Var2) {
      return false;
    }
    dVar5 = (al->data).constant.level;
    if (1.0 < ABS(dVar5)) {
      return false;
    }
    dVar5 = round(dVar5 * 32766.0);
    (lin->u).constant.level = (__s16)(int)dVar5;
    dVar5 = (al->data).constant.envelope.attack_length;
    dVar6 = ABS(dVar5);
    if (1.0 < dVar6) {
      return dVar6 <= 1.0;
    }
    dVar5 = dVar5 * 32766.0;
    goto LAB_00194a09;
  default:
    return false;
  }
  dVar5 = (al->data).constant.envelope.attack_length;
  if (0.0 > dVar5 || dVar5 > 1.0) {
    return 0.0 <= dVar5 && dVar5 <= 1.0;
  }
  dVar5 = dVar5 * 32767.0;
LAB_00194a09:
  dVar5 = round(dVar5);
  (lin->u).constant.envelope.attack_length = (__u16)(int)dVar5;
  return true;
}

Assistant:

static bool lhap_effect2lin(struct ff_effect *lin, ALLEGRO_HAPTIC_EFFECT *al)
{
   memset(lin, 0, sizeof(*lin));

   if (!lhap_type2lin(&lin->type, al->type))
      return false;
   /* lin_effect->replay = effect->re; */
   lin->direction = (__u16)
      round(((double)0xC000 * al->direction.angle) / (2 * M_PI));
   lin->id = -1;
   if (!lhap_replay2lin(&lin->replay, &al->replay))
      return false;
   switch (lin->type) {
      case FF_RUMBLE:
         return lhap_rumble2lin(&lin->u.rumble, &al->data.rumble);
      case FF_PERIODIC:
         return lhap_periodic2lin(&lin->u.periodic, &al->data.periodic);
      case FF_CONSTANT:
         return lhap_constant2lin(&lin->u.constant, &al->data.constant);
      case FF_RAMP:
         return lhap_ramp2lin(&lin->u.ramp, &al->data.ramp);
      case FF_SPRING:   /* fall through */
      case FF_FRICTION: /* fall through */
      case FF_DAMPER:   /* fall through */
      case FF_INERTIA:
         return lhap_condition2lin(&lin->u.condition[0], &al->data.condition);
      default:
         return false;
   }
}